

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::
ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
          (EpsCopyInputStream *this,char *ptr,anon_class_32_4_91646d40 add)

{
  byte bVar1;
  anon_class_32_4_91646d40 add_00;
  anon_class_32_4_91646d40 add_01;
  anon_class_32_4_91646d40 add_02;
  int iVar2;
  char *pcVar3;
  Nonnull<const_char_*> pcVar4;
  char *pcVar5;
  uint uVar6;
  char *unaff_R12;
  int iVar7;
  uint uVar8;
  char *ptr_00;
  pair<const_char_*,_int> pVar9;
  char buf [26];
  char *local_78;
  undefined2 uStack_70;
  undefined6 local_6e;
  undefined2 uStack_68;
  undefined8 uStack_66;
  RepeatedField<int> *local_58;
  FieldDescriptor *pFStack_50;
  Reflection *local_48;
  Message *pMStack_40;
  
  local_48 = add.reflection;
  pMStack_40 = add.msg;
  local_58 = add.rep_enum;
  pFStack_50 = add.field;
  bVar1 = *ptr;
  uVar6 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar9 = ReadSizeFallback(ptr,(uint)bVar1);
    ptr_00 = pVar9.first;
    uVar6 = pVar9.second;
  }
  else {
    ptr_00 = ptr + 1;
  }
  if (ptr_00 == (char *)0x0) {
LAB_00270d0f:
    unaff_R12 = (char *)0x0;
  }
  else {
    iVar2 = *(int *)&this->buffer_end_ - (int)ptr_00;
    do {
      iVar7 = uVar6 - iVar2;
      if (iVar7 == 0 || (int)uVar6 < iVar2) {
        add_02.field = pFStack_50;
        add_02.rep_enum = local_58;
        add_02.reflection = local_48;
        add_02.msg = pMStack_40;
        pcVar5 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                           (ptr_00,ptr_00 + (int)uVar6,add_02);
        if (ptr_00 + (int)uVar6 != pcVar5) {
          return (char *)0x0;
        }
        return pcVar5;
      }
      add_00.field = pFStack_50;
      add_00.rep_enum = local_58;
      add_00.reflection = local_48;
      add_00.msg = pMStack_40;
      ptr_00 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                         (ptr_00,this->buffer_end_,add_00);
      if (ptr_00 == (char *)0x0) goto LAB_00270d0f;
      pcVar5 = this->buffer_end_;
      uVar8 = (int)ptr_00 - (int)pcVar5;
      if (0x10 < uVar8) {
        ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                  ((EpsCopyInputStream *)&local_78);
LAB_00270d5e:
        ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                  ();
      }
      if (iVar7 < 0x11) {
        uStack_68 = 0;
        uStack_66 = 0;
        local_78 = *(char **)pcVar5;
        uStack_70 = (undefined2)*(undefined8 *)(pcVar5 + 8);
        local_6e = (undefined6)((ulong)*(undefined8 *)(pcVar5 + 8) >> 0x10);
        add_01.field = pFStack_50;
        add_01.rep_enum = local_58;
        add_01.reflection = local_48;
        add_01.msg = pMStack_40;
        pcVar3 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                           ((char *)((long)&local_78 + (ulong)(uVar8 & 0x1f)),
                            (char *)((long)&local_78 + (long)iVar7),add_01);
        pcVar5 = (char *)0x0;
        unaff_R12 = this->buffer_end_ + ((long)pcVar3 - (long)&local_78);
        if (pcVar3 != (char *)((long)&local_78 + (long)iVar7)) {
          unaff_R12 = pcVar5;
        }
      }
      else {
        uVar6 = uVar6 - (iVar2 + uVar8);
        if ((int)uVar6 < 1) {
          pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             ((long)(int)uVar6,0,"size > 0");
        }
        else {
          pcVar4 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar4 != (Nonnull<const_char_*>)0x0) goto LAB_00270d5e;
        if ((this->limit_ < 0x11) || (ptr_00 = Next(this), ptr_00 == (char *)0x0)) {
          pcVar5 = (char *)0x0;
          unaff_R12 = (char *)0x0;
        }
        else {
          ptr_00 = ptr_00 + (uVar8 & 0x1f);
          iVar2 = *(int *)&this->buffer_end_ - (int)ptr_00;
          pcVar5 = (char *)0x1;
        }
      }
    } while ((char)pcVar5 != '\0');
  }
  return unaff_R12;
}

Assistant:

[[nodiscard]] const char* ReadPackedVarint(const char* ptr, Add add) {
    return ReadPackedVarint(ptr, add, [](int) {});
  }